

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytrie.c
# Opt level: O2

void * tommy_trie_remove_existing(tommy_trie *trie,tommy_trie_node *node)

{
  long lVar1;
  tommy_trie_node *ptVar2;
  tommy_key_t in_R8D;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ptVar2 = trie_bucket_remove_existing
                     (trie,(int)trie + (node->key >> 0x1b) * 8,&node->next,
                      (tommy_trie_node *)(ulong)node->key,in_R8D);
  if (ptVar2 != node) {
    __assert_fail("ret == node",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/third-party/tommyds/tommytrie.c"
                  ,0x118,"void *tommy_trie_remove_existing(tommy_trie *, tommy_trie_node *)");
  }
  trie->count = trie->count - 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return ptVar2->data;
  }
  __stack_chk_fail();
}

Assistant:

void* tommy_trie_remove_existing(tommy_trie* trie, tommy_trie_node* node)
{
	tommy_trie_node* ret;
	tommy_key_t key = node->key;
	tommy_trie_node** let_ptr;

	let_ptr = &trie->bucket[key >> TOMMY_TRIE_BUCKET_SHIFT];

	ret = trie_bucket_remove_existing(trie, TOMMY_TRIE_BUCKET_SHIFT, let_ptr, node, key);

	/* the element removed must match the one passed */
	assert(ret == node);

	--trie->count;

	return ret->data;
}